

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperVec.c
# Opt level: O0

void Map_NodeVecRemove(Map_NodeVec_t *p,Map_Node_t *Entry)

{
  int iVar1;
  int local_1c;
  int i;
  Map_Node_t *Entry_local;
  Map_NodeVec_t *p_local;
  
  for (local_1c = 0; (local_1c < p->nSize && (p->pArray[local_1c] != Entry));
      local_1c = local_1c + 1) {
  }
  iVar1 = local_1c;
  if (p->nSize <= local_1c) {
    __assert_fail("i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperVec.c"
                  ,0x100,"void Map_NodeVecRemove(Map_NodeVec_t *, Map_Node_t *)");
  }
  while (local_1c = iVar1 + 1, local_1c < p->nSize) {
    p->pArray[iVar1] = p->pArray[local_1c];
    iVar1 = local_1c;
  }
  p->nSize = p->nSize + -1;
  return;
}

Assistant:

void Map_NodeVecRemove( Map_NodeVec_t * p, Map_Node_t * Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            break;
    assert( i < p->nSize );
    for ( i++; i < p->nSize; i++ )
        p->pArray[i-1] = p->pArray[i];
    p->nSize--;
}